

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O0

ExprBase *
EvaluateVariableDefinitions(ExpressionEvalContext *ctx,ExprVariableDefinitions *expression)

{
  bool bVar1;
  ExprBase *pEVar2;
  ExprBase *local_28;
  ExprBase *definition;
  ExprVariableDefinitions *expression_local;
  ExpressionEvalContext *ctx_local;
  
  bVar1 = AddInstruction(ctx);
  if (bVar1) {
    for (local_28 = (expression->definitions).head; local_28 != (ExprBase *)0x0;
        local_28 = local_28->next) {
      pEVar2 = Evaluate(ctx,local_28);
      if (pEVar2 == (ExprBase *)0x0) {
        return (ExprBase *)0x0;
      }
    }
    pEVar2 = &ExpressionContext::get<ExprVoid>(ctx->ctx)->super_ExprBase;
    ExprVoid::ExprVoid((ExprVoid *)pEVar2,(expression->super_ExprBase).source,ctx->ctx->typeVoid);
    ctx_local = (ExpressionEvalContext *)CheckType(&expression->super_ExprBase,pEVar2);
  }
  else {
    ctx_local = (ExpressionEvalContext *)0x0;
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* EvaluateVariableDefinitions(ExpressionEvalContext &ctx, ExprVariableDefinitions *expression)
{
	if(!AddInstruction(ctx))
		return NULL;

	for(ExprBase *definition = expression->definitions.head; definition; definition = definition->next)
	{
		if(!Evaluate(ctx, definition))
			return NULL;
	}

	return CheckType(expression, new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid));
}